

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss_functions.cc
# Opt level: O0

float __thiscall
hingeloss::getLoss(hingeloss *this,shared_data *param_2,float prediction,float label)

{
  ostream *poVar1;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float e;
  float local_20;
  
  if (((in_XMM1_Da != -1.0) || (NAN(in_XMM1_Da))) && ((in_XMM1_Da != 1.0 || (NAN(in_XMM1_Da))))) {
    poVar1 = std::operator<<((ostream *)&std::cout,"You are using label ");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,in_XMM1_Da);
    poVar1 = std::operator<<(poVar1," not -1 or 1 as loss function expects!");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  local_20 = -in_XMM1_Da * in_XMM0_Da + 1.0;
  if (local_20 <= 0.0) {
    local_20 = 0.0;
  }
  return local_20;
}

Assistant:

float getLoss(shared_data*, float prediction, float label)
  {
    if (label != -1.f && label != 1.f)
      cout << "You are using label " << label << " not -1 or 1 as loss function expects!" << endl;
    float e = 1 - label * prediction;
    return (e > 0) ? e : 0;
  }